

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

bool cmSystemTools::IsOff(char *val)

{
  char *val_local;
  
  if ((val == (char *)0x0) || (*val == '\0')) {
    val_local._7_1_ = true;
  }
  else if ((*val == '0') && (val[1] == '\0')) {
    val_local._7_1_ = true;
  }
  else if ((((*val == 'O') || (*val == 'o')) && ((val[1] == 'F' || (val[1] == 'f')))) &&
          (((val[2] == 'F' || (val[2] == 'f')) && (val[3] == '\0')))) {
    val_local._7_1_ = true;
  }
  else if (((*val == 'N') || (*val == 'n')) &&
          ((val[1] == '\0' || (((val[1] == 'O' || (val[1] == 'o')) && (val[2] == '\0')))))) {
    val_local._7_1_ = true;
  }
  else if ((((*val == 'F') || (*val == 'f')) &&
           (((val[1] == 'A' || (val[1] == 'a')) && ((val[2] == 'L' || (val[2] == 'l')))))) &&
          (((val[3] == 'S' || (val[3] == 's')) &&
           (((val[4] == 'E' || (val[4] == 'e')) && (val[5] == '\0')))))) {
    val_local._7_1_ = true;
  }
  else if (((((*val == 'I') || (*val == 'i')) && ((val[1] == 'G' || (val[1] == 'g')))) &&
           ((val[2] == 'N' || (val[2] == 'n')))) &&
          (((val[3] == 'O' || (val[3] == 'o')) &&
           ((((val[4] == 'R' || (val[4] == 'r')) && ((val[5] == 'E' || (val[5] == 'e')))) &&
            (val[6] == '\0')))))) {
    val_local._7_1_ = true;
  }
  else {
    val_local._7_1_ = IsNOTFOUND(val);
  }
  return val_local._7_1_;
}

Assistant:

bool cmSystemTools::IsOff(const char* val)
{
  // ""
  if (!val || val[0] == '\0') {
    return true;
  }
  /* clang-format off */
  // "0"
  if (val[0] == '0' && val[1] == '\0') {
    return true;
  }
  // "OFF"
  if ((val[0] == 'O' || val[0] == 'o') &&
      (val[1] == 'F' || val[1] == 'f') &&
      (val[2] == 'F' || val[2] == 'f') && val[3] == '\0') {
    return true;
  }
  // "N", "NO"
  if ((val[0] == 'N' || val[0] == 'n') && (val[1] == '\0' || (
      (val[1] == 'O' || val[1] == 'o') && val[2] == '\0'))) {
    return true;
  }
  // "FALSE"
  if ((val[0] == 'F' || val[0] == 'f') &&
      (val[1] == 'A' || val[1] == 'a') &&
      (val[2] == 'L' || val[2] == 'l') &&
      (val[3] == 'S' || val[3] == 's') &&
      (val[4] == 'E' || val[4] == 'e') && val[5] == '\0') {
    return true;
  }
  // "IGNORE"
  if ((val[0] == 'I' || val[0] == 'i') &&
      (val[1] == 'G' || val[1] == 'g') &&
      (val[2] == 'N' || val[2] == 'n') &&
      (val[3] == 'O' || val[3] == 'o') &&
      (val[4] == 'R' || val[4] == 'r') &&
      (val[5] == 'E' || val[5] == 'e') && val[6] == '\0') {
    return true;
  }
  /* clang-format on */
  return cmSystemTools::IsNOTFOUND(val);
}